

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O3

unique_ptr<duckdb::ColumnWriterStatistics,_std::default_delete<duckdb::ColumnWriterStatistics>,_true>
 __thiscall
duckdb::StandardColumnWriter<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>::
InitializeStatsState
          (StandardColumnWriter<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>
           *this)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)operator_new(0x50);
  *pp_Var1 = (_func_int *)&PTR__StringStatisticsState_019b1928;
  *(undefined1 *)(pp_Var1 + 1) = 0x1a;
  *(undefined4 *)((long)pp_Var1 + 9) = 0;
  pp_Var1[2] = (_func_int *)(pp_Var1 + 4);
  pp_Var1[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var1 + 4) = 0;
  pp_Var1[6] = (_func_int *)(pp_Var1 + 8);
  pp_Var1[7] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var1 + 8) = 0;
  (this->super_PrimitiveColumnWriter).super_ColumnWriter._vptr_ColumnWriter = pp_Var1;
  return (unique_ptr<duckdb::ColumnWriterStatistics,_std::default_delete<duckdb::ColumnWriterStatistics>_>
          )(unique_ptr<duckdb::ColumnWriterStatistics,_std::default_delete<duckdb::ColumnWriterStatistics>_>
            )this;
}

Assistant:

unique_ptr<ColumnWriterStatistics> InitializeStatsState() override {
		return OP::template InitializeStats<SRC, TGT>();
	}